

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O0

optional<unsigned_int>
jbcoin::get<unsigned_int,jbcoin::STInteger<unsigned_int>>
          (STObject *st,TypedField<jbcoin::STInteger<unsigned_int>_> *f)

{
  int iVar1;
  STBase *pSVar2;
  STInteger<unsigned_int> *local_48;
  STInteger<unsigned_int> *u;
  SerializedTypeID id;
  STBase *b;
  TypedField<jbcoin::STInteger<unsigned_int>_> *f_local;
  STObject *st_local;
  optional<unsigned_int> t;
  
  boost::optional<unsigned_int>::optional((optional<unsigned_int> *)&st_local);
  pSVar2 = STObject::peekAtPField(st,&f->super_SField);
  if ((pSVar2 != (STBase *)0x0) && (iVar1 = (*pSVar2->_vptr_STBase[4])(), iVar1 != 0)) {
    if (pSVar2 == (STBase *)0x0) {
      local_48 = (STInteger<unsigned_int> *)0x0;
    }
    else {
      local_48 = (STInteger<unsigned_int> *)
                 __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    }
    if (local_48 == (STInteger<unsigned_int> *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    STExchange<jbcoin::STInteger<unsigned_int>,_unsigned_int>::get
              ((optional<unsigned_int> *)&st_local,local_48);
  }
  return (optional<unsigned_int>)(type)st_local;
}

Assistant:

boost::optional<T>
get (STObject const& st,
    TypedField<U> const& f)
{
    boost::optional<T> t;
    STBase const* const b =
        st.peekAtPField(f);
    if (! b)
        return t;
    auto const id = b->getSType();
    if (id == STI_NOTPRESENT)
        return t;
    auto const u =
        dynamic_cast<U const*>(b);
    // This should never happen
    if (! u)
        Throw<std::runtime_error> (
            "Wrong field type");
    STExchange<U, T>::get(t, *u);
    return t;
}